

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

pair<google::protobuf::Map<int,_google::protobuf::Api>::iterator,_bool> * __thiscall
google::protobuf::Map<int,google::protobuf::Api>::TryEmplaceInternal<int_const&>
          (pair<google::protobuf::Map<int,_google::protobuf::Api>::iterator,_bool>
           *__return_storage_ptr__,void *this,int *k)

{
  bool bVar1;
  map_index_t b;
  NodeBase *node;
  NodeAndBucket NVar2;
  
  NVar2 = internal::KeyMapBase<unsigned_int>::FindHelper((KeyMapBase<unsigned_int> *)this,*k);
  node = NVar2.node;
  b = NVar2.bucket;
  if (node == (NodeBase *)0x0) {
    bVar1 = internal::KeyMapBase<unsigned_int>::ResizeIfLoadIsOutOfRange
                      ((KeyMapBase<unsigned_int> *)this,(ulong)(*this + 1));
    if (bVar1) {
      b = internal::KeyMapBase<unsigned_int>::BucketNumber((KeyMapBase<unsigned_int> *)this,*k);
    }
    node = internal::UntypedMapBase::AllocNode((UntypedMapBase *)this,0x90);
    *(int *)&node[1].next = *k;
    Api::Api((Api *)(node + 2),*(Arena **)((long)this + 0x18));
    internal::KeyMapBase<unsigned_int>::InsertUnique
              ((KeyMapBase<unsigned_int> *)this,b,(KeyNode *)node);
    *(int *)this = *this + 1;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  (__return_storage_ptr__->first).super_UntypedMapIterator.node_ = node;
  (__return_storage_ptr__->first).super_UntypedMapIterator.m_ = (UntypedMapBase *)this;
  (__return_storage_ptr__->first).super_UntypedMapIterator.bucket_index_ = b;
  __return_storage_ptr__->second = bVar1;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> TryEmplaceInternal(K&& k, Args&&... args) {
    auto p = this->FindHelper(TS::ToView(k));
    internal::map_index_t b = p.bucket;
    // Case 1: key was already present.
    if (p.node != nullptr) {
      return std::make_pair(iterator(internal::UntypedMapIterator{
                                static_cast<Node*>(p.node), this, p.bucket}),
                            false);
    }
    // Case 2: insert.
    if (this->ResizeIfLoadIsOutOfRange(this->num_elements_ + 1)) {
      b = this->BucketNumber(TS::ToView(k));
    }
    auto* node = CreateNode(std::forward<K>(k), std::forward<Args>(args)...);
    this->InsertUnique(b, node);
    ++this->num_elements_;
    return std::make_pair(iterator(internal::UntypedMapIterator{node, this, b}),
                          true);
  }